

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint8_t add8_sat(uint8_t a,uint8_t b)

{
  byte local_b;
  uint8_t res;
  uint8_t b_local;
  uint8_t a_local;
  
  local_b = a + b;
  if ((((local_b ^ a) & 0x80) != 0) && (((a ^ b) & 0x80) == 0)) {
    if ((a & 0x80) == 0) {
      local_b = 0x7f;
    }
    else {
      local_b = 0x80;
    }
  }
  return local_b;
}

Assistant:

static inline uint8_t add8_sat(uint8_t a, uint8_t b)
{
    uint8_t res;

    res = a + b;
    if (((res ^ a) & 0x80) && !((a ^ b) & 0x80)) {
        if (a & 0x80)
            res = 0x80;
        else
            res = 0x7f;
    }
    return res;
}